

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CheckerMemberVisitor::handle(CheckerMemberVisitor *this,MemberAccessExpression *expr)

{
  SourceLocation noteLocation;
  bool bVar1;
  Symbol *pSVar2;
  MemberAccessExpression *in_RSI;
  Type *in_RDI;
  Diagnostic *diag;
  Symbol *sym;
  Type *valueType;
  Scope *in_stack_000000e8;
  undefined1 in_stack_000000f0 [16];
  DiagCode in_stack_00000104;
  Expression *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  DiagCode noteCode;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  CheckerMemberVisitor *in_stack_ffffffffffffffd8;
  Type *this_00;
  
  this_00 = in_RDI;
  MemberAccessExpression::value(in_RSI);
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x444e7d);
  bVar1 = Type::isFixedSize(this_00);
  if (((!bVar1) || (bVar1 = Type::isClass((Type *)0x444e9c), bVar1)) &&
     (bVar1 = Expression::bad(in_stack_ffffffffffffffb0), !bVar1)) {
    MemberAccessExpression::value(in_RSI);
    pSVar2 = Expression::getSymbolReference((Expression *)this_00,SUB81((ulong)in_RSI >> 0x38,0));
    if ((pSVar2 != (Symbol *)0x0) &&
       (bVar1 = isFromChecker(in_stack_ffffffffffffffd8,
                              (Symbol *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)), !bVar1
       )) {
      noteCode = SUB84((in_RSI->super_Expression).sourceRange.startLoc,4);
      Scope::addDiag(in_stack_000000e8,in_stack_00000104,(SourceRange)in_stack_000000f0);
      noteLocation._4_4_ = 0x50001;
      noteLocation._0_4_ = in_stack_ffffffffffffffb8;
      Diagnostic::addNote((Diagnostic *)pSVar2->location,noteCode,noteLocation);
      return;
    }
  }
  ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
  visitDefault<slang::ast::MemberAccessExpression>
            ((ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *)
             in_stack_ffffffffffffffb0,(MemberAccessExpression *)in_RDI);
  return;
}

Assistant:

void handle(const MemberAccessExpression& expr) {
        auto& valueType = *expr.value().type;
        if ((!valueType.isFixedSize() || valueType.isClass()) && !expr.bad()) {
            if (auto sym = expr.value().getSymbolReference(); sym && !isFromChecker(*sym)) {
                auto& diag = body.addDiag(diag::DynamicFromChecker, expr.sourceRange);
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                return;
            }
        }
        visitDefault(expr);
    }